

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::WriteImport(WatWriter *this,Import *import)

{
  ExternalKind EVar1;
  FuncImport *pFVar2;
  TableImport *pTVar3;
  MemoryImport *pMVar4;
  GlobalImport *pGVar5;
  EventImport *pEVar6;
  string_view local_38;
  string_view local_28;
  Import *local_18;
  Import *import_local;
  WatWriter *this_local;
  
  local_18 = import;
  import_local = (Import *)this;
  if ((this->options_->inline_import & 1U) == 0) {
    WriteOpenSpace(this,"import");
    string_view::string_view(&local_28,&local_18->module_name);
    WriteQuotedString(this,local_28,Space);
    string_view::string_view(&local_38,&local_18->field_name);
    WriteQuotedString(this,local_38,Space);
  }
  EVar1 = Import::kind(local_18);
  switch(EVar1) {
  case First:
    pFVar2 = cast<wabt::FuncImport,wabt::Import>(local_18);
    WriteBeginFunc(this,&pFVar2->func);
    WriteCloseSpace(this);
    break;
  case Table:
    pTVar3 = cast<wabt::TableImport,wabt::Import>(local_18);
    WriteTable(this,&pTVar3->table);
    break;
  case Memory:
    pMVar4 = cast<wabt::MemoryImport,wabt::Import>(local_18);
    WriteMemory(this,&pMVar4->memory);
    break;
  case Global:
    pGVar5 = cast<wabt::GlobalImport,wabt::Import>(local_18);
    WriteBeginGlobal(this,&pGVar5->global);
    WriteCloseSpace(this);
    break;
  case Event:
    pEVar6 = cast<wabt::EventImport,wabt::Import>(local_18);
    WriteEvent(this,&pEVar6->event);
  }
  if ((this->options_->inline_import & 1U) == 0) {
    WriteCloseNewline(this);
  }
  else {
    WriteNewline(this,false);
  }
  return;
}

Assistant:

void WatWriter::WriteImport(const Import& import) {
  if (!options_.inline_import) {
    WriteOpenSpace("import");
    WriteQuotedString(import.module_name, NextChar::Space);
    WriteQuotedString(import.field_name, NextChar::Space);
  }

  switch (import.kind()) {
    case ExternalKind::Func:
      WriteBeginFunc(cast<FuncImport>(&import)->func);
      WriteCloseSpace();
      break;

    case ExternalKind::Table:
      WriteTable(cast<TableImport>(&import)->table);
      break;

    case ExternalKind::Memory:
      WriteMemory(cast<MemoryImport>(&import)->memory);
      break;

    case ExternalKind::Global:
      WriteBeginGlobal(cast<GlobalImport>(&import)->global);
      WriteCloseSpace();
      break;

    case ExternalKind::Event:
      WriteEvent(cast<EventImport>(&import)->event);
      break;
  }

  if (options_.inline_import) {
    WriteNewline(NO_FORCE_NEWLINE);
  } else {
    WriteCloseNewline();
  }
}